

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionEvaluator.hpp
# Opt level: O3

void __thiscall OpenMD::SelectionEvaluator::invalidIndex(SelectionEvaluator *this,int index)

{
  long *plVar1;
  long *plVar2;
  long *plVar3;
  long local_48;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  int local_34;
  string local_30;
  
  local_34 = index;
  toString<int>(&local_30,&local_34);
  plVar1 = (long *)std::__cxx11::string::replace((ulong)&local_30,0,(char *)0x0,0x297fb1);
  plVar3 = plVar1 + 2;
  if ((long *)*plVar1 == plVar3) {
    local_48 = *plVar3;
    uStack_40 = (undefined4)plVar1[3];
    uStack_3c = *(undefined4 *)((long)plVar1 + 0x1c);
    plVar2 = &local_48;
  }
  else {
    local_48 = *plVar3;
    plVar2 = (long *)*plVar1;
  }
  *plVar1 = (long)plVar3;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  snprintf(painCave.errMsg,2000,"SelectionEvaluator Error: %s\n",plVar2);
  painCave.isFatal = 1;
  painCave.severity = 1;
  simError();
  if (plVar2 != &local_48) {
    operator_delete(plVar2,local_48 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void invalidIndex(int index) {
      evalError("invalid index : " + toString(index));
    }